

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O2

_Bool borg_flow_commit(char *who,wchar_t why)

{
  byte bVar1;
  char *what;
  
  bVar1 = borg_data_cost->data[borg.c.y][borg.c.x];
  if (bVar1 < 0xfa) {
    if (who != (char *)0x0) {
      what = format("# Flowing toward %s at cost %d",who,(ulong)(uint)bVar1);
      borg_note(what);
    }
    memcpy(borg_data_flow,borg_data_cost,0x330c);
    borg.goal.type = (int16_t)why;
  }
  return bVar1 < 0xfa;
}

Assistant:

bool borg_flow_commit(const char *who, int why)
{
    int cost;

    /* Cost of current grid */
    cost = borg_data_cost->data[borg.c.y][borg.c.x];

    /* Verify the total "cost" */
    if (cost >= 250)
        return false;

    /* Message */
    if (who)
        borg_note(format("# Flowing toward %s at cost %d", who, cost));

    /* Obtain the "flow" information */
    memcpy(borg_data_flow, borg_data_cost, sizeof(borg_data));

    /* Save the goal type */
    borg.goal.type = why;

    /* Success */
    return true;
}